

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

bool __thiscall
tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement
          (LeftmostActiveOnly *this,Node *node,Rectangle *item)

{
  int iVar1;
  Packing2D *packing;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int newActiveX;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  double local_38;
  
  packing = (node->Packing)._M_t.
            super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
            super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
            super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl;
  bVar3 = IsPlacementFeasible(this,packing,item);
  if (bVar3) {
    _local_50 = *(_func_int ***)packing;
    local_48 = item->Dx;
    local_44 = item->Dy;
    local_40._0_4_ = item->InternId;
    local_40._4_4_ = item->ExternId;
    local_38 = (double)(local_44 * local_48);
    Packing2D::AddItem(packing,(Rectangle *)&stack0xffffffffffffffb0,
                       (node->super_BaseNode).ItemIdToPlace);
    iVar7 = packing->ActiveX;
    iVar1 = packing->ActiveY;
    AddSuccessfulPlacementDummy(this,packing);
    iVar4 = item->Dy;
    iVar5 = iVar4 + iVar1;
    uVar2 = (packing->PlacedAreaVector).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5];
    uVar6 = (packing->DeactivatedAreaVector).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5];
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    if ((iVar5 == (this->container).super_Rectangle.Dy) ||
       ((ulong)((long)item->Dx + (long)iVar7) < uVar6)) {
      FindNewBottomLeft((LeftmostActiveOnly *)&stack0xffffffffffffffb0,(Packing2D *)this);
      packing->ActiveX = local_48;
      packing->ActiveY = local_50;
    }
    else {
      packing->ActiveX = (int)uVar6;
      packing->ActiveY = packing->ActiveY + iVar4;
    }
    iVar7 = iVar7 + item->Dx;
    iVar4 = packing->MaxX;
    if (packing->MaxX <= iVar7) {
      iVar4 = iVar7;
    }
    packing->MaxX = iVar4;
    if (iVar1 == 0) {
      if (iVar7 <= packing->AbscissaMaxX) {
        __assert_fail("placedX + item.Dx > packing.AbscissaMaxX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                      ,0x4ae,
                      "bool tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement(Node &, const Rectangle &)"
                     );
      }
      packing->AbscissaMaxX = iVar7;
    }
  }
  return bVar3;
}

Assistant:

bool LeftmostActiveOnly::PlaceBottomLeftPlacement(Node& node, const Rectangle& item)
{
    Packing2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.AddItem(Rectangle{packing.ActiveX, packing.ActiveY, item.Dx, item.Dy, item.InternId, item.ExternId}, node.ItemIdToPlace);

        int placedX = packing.ActiveX;
        int placedY = packing.ActiveY;

        // Add dummy item for area left of current placement.
        AddSuccessfulPlacementDummy(packing);

        size_t xAboveNewY = std::max<size_t>(packing.PlacedAreaVector[placedY + item.Dy], packing.DeactivatedAreaVector[placedY + item.Dy]);

        if (placedY + item.Dy == this->container.Dy || xAboveNewY > placedX + item.Dx)
        {
            auto [newActiveX, newActiveY] = FindNewBottomLeft(packing);

            packing.ActiveX = newActiveX;
            packing.ActiveY = newActiveY;
        }
        else
        {
            int newActiveX = xAboveNewY;

            packing.ActiveX = newActiveX;
            packing.ActiveY += item.Dy;
        }

        packing.MaxX = std::max<int>(packing.MaxX, placedX + item.Dx);
        if (placedY == 0)
        {
            assert(placedX + item.Dx > packing.AbscissaMaxX);
            packing.AbscissaMaxX = placedX + item.Dx;
        }

        return true;
    }

    // Placement was infeasible: Prune node, deactivate placement i, activate placement ii.
    return false;
}